

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

int IoTHubTransport_AMQP_SetCallbackContext(TRANSPORT_LL_HANDLE handle,void *ctx)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x910;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                ,"IoTHubTransport_AMQP_SetCallbackContext",0x90f,1,
                "Invalid parameter specified handle: %p",0);
    }
  }
  else {
    *(void **)((long)handle + 0xe0) = ctx;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int IoTHubTransport_AMQP_SetCallbackContext(TRANSPORT_LL_HANDLE handle, void* ctx)
{
    int result;
    if (handle == NULL)
    {
        LogError("Invalid parameter specified handle: %p", handle);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        instance->transport_ctx = ctx;
        result = 0;
    }
    return result;
}